

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O2

ON_BezierCurve * __thiscall ON_BezierCurve::operator=(ON_BezierCurve *this,ON_3dPointArray *cv)

{
  bool bVar1;
  double *Point;
  long lVar2;
  int i;
  long lVar3;
  
  bVar1 = Create(this,3,false,(cv->super_ON_SimpleArray<ON_3dPoint>).m_count);
  if (bVar1) {
    lVar2 = 0;
    for (lVar3 = 0; lVar3 < this->m_order; lVar3 = lVar3 + 1) {
      Point = ON_3dPoint::operator_cast_to_double_
                        ((ON_3dPoint *)
                         ((long)&((cv->super_ON_SimpleArray<ON_3dPoint>).m_a)->x + lVar2));
      SetCV(this,(int)lVar3,intrinsic_point_style,Point);
      lVar2 = lVar2 + 0x18;
    }
  }
  return this;
}

Assistant:

ON_BezierCurve& ON_BezierCurve::operator=(const ON_3dPointArray& cv)
{
  if ( Create( 3, false, cv.Count() ) )
  {
    int i;
    for ( i = 0; i < m_order; i++ )
      SetCV( i, ON::intrinsic_point_style, cv[i] );
  }
  return *this;
}